

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O1

void ovf::detail::parse::v2::ovf_segment_header_action<ovf::detail::parse::v2::segment_header>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *file,ovf_segment *segment)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  int iVar3;
  parse_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long lVar4;
  ulong uVar5;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [504];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (file->_state->found_title == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"title","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_meshunit == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"meshunit","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_valueunits == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"valueunits","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_valuelabels == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"valuelabels","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_xmin == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"xmin","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_ymin == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ymin","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_zmin == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"zmin","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_xmax == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"xmax","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_ymax == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ymax","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_zmax == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"zmax","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  if (file->_state->found_meshtype == false) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"meshtype","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::string((string *)&local_280,segment->meshtype,(allocator *)&local_68);
  iVar3 = std::__cxx11::string::compare((char *)&local_280);
  paVar1 = &local_280.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (iVar3 == 0) {
    segment->N = segment->n_cells[1] * segment->n_cells[0] * segment->n_cells[2];
    if (file->_state->found_xbase == false) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"xbase","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                 &local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    if (file->_state->found_ybase == false) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ybase","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                 &local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    if (file->_state->found_zbase == false) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"zbase","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                 &local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    if (file->_state->found_xstepsize == false) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"xstepsize","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                 &local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    if (file->_state->found_ystepsize == false) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ystepsize","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                 &local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    if (file->_state->found_zstepsize == false) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"zstepsize","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                 &local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    if (file->_state->found_xnodes == false) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"xnodes","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                 &local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    if (file->_state->found_ynodes == false) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ynodes","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                 &local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    if (file->_state->found_znodes != false) goto LAB_0014d0d1;
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"znodes","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
  }
  else {
    std::__cxx11::string::string((string *)&local_280,segment->meshtype,(allocator *)&local_68);
    iVar3 = std::__cxx11::string::compare((char *)&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((iVar3 != 0) || (segment->N = segment->pointcount, file->_state->found_pointcount != false))
    goto LAB_0014d0d1;
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"pointcount","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               &local_280);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
LAB_0014d0d1:
  if (local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b8);
    return;
  }
  fmt::v5::format<char[23],std::__cxx11::string>
            (&local_68,(v5 *)"Missing keywords: \"{}\"",
             (char (*) [23])
             local_2b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,in_RCX);
  if (0x20 < (ulong)((long)local_2b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar5 = 1;
    lVar4 = 0x28;
    do {
      puVar2 = (undefined8 *)
               ((long)local_2b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
      local_48 = *puVar2;
      uStack_40 = puVar2[1];
      local_280.field_2._M_allocated_capacity = 0;
      local_280._M_dataplus._M_p = (pointer)&PTR_grow_00178c20;
      local_280._M_string_length = (size_type)local_260;
      local_280.field_2._8_8_ = 500;
      format_str.size_ = 6;
      format_str.data_ = ", \"{}\"";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_48;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string>
                    ::TYPES;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_280,format_str,args);
      local_2a0[0] = local_290;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2a0,local_280._M_string_length,
                 (undefined1 *)
                 (local_280._M_string_length + local_280.field_2._M_allocated_capacity));
      local_280._M_dataplus._M_p = (pointer)&PTR_grow_00178c20;
      if ((undefined1 *)local_280._M_string_length != local_260) {
        operator_delete((void *)local_280._M_string_length);
      }
      std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_2a0[0]);
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0]);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (ulong)((long)local_2b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this = (parse_error *)__cxa_allocate_exception(0x28);
  tao::pegtl::parse_error::
  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
            (this,&local_68,in);
  __cxa_throw(this,&tao::pegtl::parse_error::typeinfo,tao::pegtl::parse_error::~parse_error);
}

Assistant:

static void apply( const Input& in, ovf_file & file, ovf_segment & segment )
            {
                // Check if all required keywords were present
                std::vector<std::string> missing_keywords(0);
                if( !file._state->found_title )
                    missing_keywords.push_back("title");
                if( !file._state->found_meshunit )
                    missing_keywords.push_back("meshunit");
                if( !file._state->found_valueunits )
                    missing_keywords.push_back("valueunits");
                if( !file._state->found_valuelabels )
                    missing_keywords.push_back("valuelabels");
                if( !file._state->found_xmin )
                    missing_keywords.push_back("xmin");
                if( !file._state->found_ymin )
                    missing_keywords.push_back("ymin");
                if( !file._state->found_zmin )
                    missing_keywords.push_back("zmin");
                if( !file._state->found_xmax )
                    missing_keywords.push_back("xmax");
                if( !file._state->found_ymax )
                    missing_keywords.push_back("ymax");
                if( !file._state->found_zmax )
                    missing_keywords.push_back("zmax");
                if( !file._state->found_meshtype )
                    missing_keywords.push_back("meshtype");

                if( std::string(segment.meshtype) == "rectangular" )
                {
                    segment.N = segment.n_cells[0] * segment.n_cells[1] * segment.n_cells[2];

                    if( !file._state->found_xbase )
                        missing_keywords.push_back("xbase");
                    if( !file._state->found_ybase )
                        missing_keywords.push_back("ybase");
                    if( !file._state->found_zbase )
                        missing_keywords.push_back("zbase");
                    if( !file._state->found_xstepsize )
                        missing_keywords.push_back("xstepsize");
                    if( !file._state->found_ystepsize )
                        missing_keywords.push_back("ystepsize");
                    if( !file._state->found_zstepsize )
                        missing_keywords.push_back("zstepsize");
                    if( !file._state->found_xnodes )
                        missing_keywords.push_back("xnodes");
                    if( !file._state->found_ynodes )
                        missing_keywords.push_back("ynodes");
                    if( !file._state->found_znodes )
                        missing_keywords.push_back("znodes");
                }
                else if( std::string(segment.meshtype) == "irregular" )
                {
                    segment.N = segment.pointcount;

                    if( !file._state->found_pointcount )
                        missing_keywords.push_back("pointcount");
                }

                if( missing_keywords.size() > 0 )
                {
                    std::string message = fmt::format( "Missing keywords: \"{}\"", missing_keywords[0] );
                    for( int i=1; i < missing_keywords.size(); ++i )
                        message += fmt::format( ", \"{}\"", missing_keywords[i] );
                    throw tao::pegtl::parse_error( message, in );
                }
            }